

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

BOOL __thiscall Js::GlobalObject::HasOwnProperty(GlobalObject *this,PropertyId propertyId)

{
  RecyclableObject *pRVar1;
  PropertyQueryFlags PVar2;
  uint uVar3;
  int iVar4;
  
  PVar2 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,(PropertyValueInfo *)0x0)
  ;
  uVar3 = 1;
  if (PVar2 != Property_Found) {
    pRVar1 = (this->directHostObject).ptr;
    uVar3 = 0;
    if (pRVar1 != (RecyclableObject *)0x0) {
      iVar4 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xb])(pRVar1,propertyId,0);
      uVar3 = (uint)(iVar4 == 1);
    }
  }
  return uVar3;
}

Assistant:

BOOL GlobalObject::HasOwnProperty(PropertyId propertyId)
    {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, nullptr /*info*/)) ||
            (this->directHostObject && this->directHostObject->HasProperty(propertyId));
    }